

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void custom_background(bool status,int color)

{
  __cxx11 local_70 [32];
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  int local_10;
  undefined1 local_9;
  int color_local;
  bool status_local;
  
  local_10 = color;
  local_9 = status;
  if (status) {
    std::__cxx11::to_string(local_70,color);
    std::operator+((char *)local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\x1b[48;5;"
                  );
    std::operator+(local_30,(char *)local_50);
    std::operator<<((ostream *)&std::cout,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
    std::operator<<((ostream *)&std::cout,"\x1b[48;5;0m");
  }
  return;
}

Assistant:

void custom_background(bool status,int color){
	if (status == true) cout<<"\033[48;5;"+to_string(color)+"m";
	else cout<<"\033[48;5;0m";
}